

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxDynamicCast::Resolve(FxDynamicCast *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  PType *pPVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar5;
  FxTypeCast *this_00;
  PPointer *pPVar6;
  undefined4 extraout_var_01;
  bool bVar7;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    pFVar1 = this->expr;
    if (pFVar1 != (FxExpression *)0x0) {
      iVar4 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
      this->expr = (FxExpression *)CONCAT44(extraout_var,iVar4);
    }
    pPVar3 = PPointer::RegistrationInfo.MyClass;
    if (this->expr != (FxExpression *)0x0) {
      pPVar2 = this->expr->ValueType;
      if ((pPVar2->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
        (pPVar2->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4);
      }
      pPVar5 = (pPVar2->super_PTypeBase).super_DObject.Class;
      bVar7 = pPVar5 != (PClass *)0x0;
      if (pPVar5 != pPVar3 && bVar7) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar7 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar3) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if ((bVar7) &&
         (*(char *)&this->expr->ValueType[1].super_PTypeBase.super_DObject.Class == '\x01')) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Cannot cast a readonly pointer");
      }
      else {
        this_00 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar1 = this->expr;
        pPVar6 = NewPointer((PType *)DObject::RegistrationInfo.MyClass,false);
        FxTypeCast::FxTypeCast(this_00,pFVar1,(PType *)pPVar6,true,true);
        this->expr = (FxExpression *)this_00;
        iVar4 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00);
        this->expr = (FxExpression *)CONCAT44(extraout_var_01,iVar4);
        if ((FxExpression *)CONCAT44(extraout_var_01,iVar4) != (FxExpression *)0x0) {
          pPVar6 = NewPointer((PType *)this->CastType,false);
          (this->super_FxExpression).ValueType = (PType *)pPVar6;
          return &this->super_FxExpression;
        }
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxDynamicCast *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxDynamicCast::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(expr, ctx);
	if (expr->ExprType == EFX_GetDefaultByType)
	{
		int a = 0;
	}
	bool constflag = expr->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && static_cast<PPointer *>(expr->ValueType)->IsConst;
	if (constflag)
	{
		// readonly pointers are normally only used for class defaults which lack type information to be cast properly, so we have to error out here.
		ScriptPosition.Message(MSG_ERROR, "Cannot cast a readonly pointer");
		delete this;
		return nullptr;
	}
	expr = new FxTypeCast(expr, NewPointer(RUNTIME_CLASS(DObject), constflag), true, true);
	expr = expr->Resolve(ctx);
	if (expr == nullptr)
	{
		delete this;
		return nullptr;
	}
	ValueType = NewPointer(CastType, constflag);
	return this;
}